

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O2

int sfp_get_vendor_revision(tcv_t *tcv,char *rev)

{
  int iVar1;
  
  iVar1 = -4;
  if ((rev != (char *)0x0 && tcv != (tcv_t *)0x0) && (tcv->data != (void *)0x0)) {
    rev[4] = '\0';
    *(undefined4 *)rev = *(undefined4 *)((long)tcv->data + 0x39);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int sfp_get_vendor_revision(tcv_t *tcv, char rev[BASIC_INFO_REG_VENDOR_REV_SIZE + 1])
{
	if (tcv == NULL || rev == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Indicates end of string */
	rev[BASIC_INFO_REG_VENDOR_REV_SIZE] = '\0';

	memcpy(rev, &((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_VENDOR_REV], BASIC_INFO_REG_VENDOR_REV_SIZE);

	return 0;
}